

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsModule.c
# Opt level: O2

cs_err option(cs_struct *handle,cs_opt_type type,size_t value)

{
  code *pcVar1;
  long lVar2;
  
  if (type == CS_OPT_SYNTAX) {
    ARM_getRegName(handle,(int)value);
    lVar2 = 0xe4;
  }
  else {
    if (type != CS_OPT_MODE) {
      return CS_ERR_OK;
    }
    if ((value & 0x10) == 0) {
      pcVar1 = ARM_getInstruction;
    }
    else {
      pcVar1 = Thumb_getInstruction;
    }
    handle->disasm = pcVar1;
    lVar2 = 4;
  }
  *(int *)((handle->ITBlock).ITStates + lVar2 + -0x5c) = (int)value;
  return CS_ERR_OK;
}

Assistant:

static cs_err option(cs_struct *handle, cs_opt_type type, size_t value)
{
	if (type == CS_OPT_MODE) {
		if (value & CS_MODE_32)
			handle->disasm = Mips_getInstruction;
		else
			handle->disasm = Mips64_getInstruction;

		handle->mode = value;
	}
	return CS_ERR_OK;
}